

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_parse_login_details
                   (char *login,size_t len,char **userp,char **passwdp,char **optionsp)

{
  void *pvVar1;
  char *pcVar2;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  char *local_78;
  char *obuf;
  size_t olen;
  size_t plen;
  size_t ulen;
  char *osep;
  char *psep;
  char *pbuf;
  char *ubuf;
  char **optionsp_local;
  char **passwdp_local;
  char **userp_local;
  size_t len_local;
  char *login_local;
  
  psep = (char *)0x0;
  ulen = 0;
  pvVar1 = memchr(login,0x3a,len);
  if (optionsp != (char **)0x0) {
    ulen = (size_t)memchr(login,0x3b,len);
  }
  if (pvVar1 == (void *)0x0) {
    local_90 = len;
    if (ulen != 0) {
      local_90 = ulen - (long)login;
    }
    local_88 = local_90;
  }
  else {
    if ((ulen == 0) || (pvVar1 <= ulen)) {
      local_80 = (long)pvVar1 - (long)login;
    }
    else {
      local_80 = ulen - (long)login;
    }
    local_88 = local_80;
  }
  if (pvVar1 == (void *)0x0) {
    local_a0 = (char *)0x0;
  }
  else {
    if ((ulen == 0) || (ulen <= pvVar1)) {
      local_98 = login + (len - (long)pvVar1);
    }
    else {
      local_98 = (char *)(ulen - (long)pvVar1);
    }
    local_a0 = local_98 + -1;
  }
  if (ulen == 0) {
    local_b0 = (char *)0x0;
  }
  else {
    if ((pvVar1 == (void *)0x0) || (pvVar1 <= ulen)) {
      local_a8 = login + (len - ulen);
    }
    else {
      local_a8 = (char *)((long)pvVar1 - ulen);
    }
    local_b0 = local_a8 + -1;
  }
  pcVar2 = (char *)Curl_memdup0(login,local_88);
  if ((pcVar2 == (char *)0x0) ||
     ((pvVar1 != (void *)0x0 &&
      (psep = (char *)Curl_memdup0((char *)((long)pvVar1 + 1),(size_t)local_a0), psep == (char *)0x0
      )))) {
LAB_0019d42f:
    (*Curl_cfree)(pcVar2);
    (*Curl_cfree)(psep);
    login_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (optionsp != (char **)0x0) {
      local_78 = (char *)0x0;
      if ((local_b0 != (char *)0x0) &&
         (local_78 = (char *)Curl_memdup0((char *)(ulen + 1),(size_t)local_b0),
         local_78 == (char *)0x0)) goto LAB_0019d42f;
      *optionsp = local_78;
    }
    *userp = pcVar2;
    *passwdp = psep;
    login_local._4_4_ = CURLE_OK;
  }
  return login_local._4_4_;
}

Assistant:

CURLcode Curl_parse_login_details(const char *login, const size_t len,
                                  char **userp, char **passwdp,
                                  char **optionsp)
{
  char *ubuf = NULL;
  char *pbuf = NULL;
  const char *psep = NULL;
  const char *osep = NULL;
  size_t ulen;
  size_t plen;
  size_t olen;

  DEBUGASSERT(userp);
  DEBUGASSERT(passwdp);

  /* Attempt to find the password separator */
  psep = memchr(login, ':', len);

  /* Attempt to find the options separator */
  if(optionsp)
    osep = memchr(login, ';', len);

  /* Calculate the portion lengths */
  ulen = (psep ?
          (size_t)(osep && psep > osep ? osep - login : psep - login) :
          (osep ? (size_t)(osep - login) : len));
  plen = (psep ?
          (osep && osep > psep ? (size_t)(osep - psep) :
           (size_t)(login + len - psep)) - 1 : 0);
  olen = (osep ?
          (psep && psep > osep ? (size_t)(psep - osep) :
           (size_t)(login + len - osep)) - 1 : 0);

  /* Clone the user portion buffer, which can be zero length */
  ubuf = Curl_memdup0(login, ulen);
  if(!ubuf)
    goto error;

  /* Clone the password portion buffer */
  if(psep) {
    pbuf = Curl_memdup0(&psep[1], plen);
    if(!pbuf)
      goto error;
  }

  /* Allocate the options portion buffer */
  if(optionsp) {
    char *obuf = NULL;
    if(olen) {
      obuf = Curl_memdup0(&osep[1], olen);
      if(!obuf)
        goto error;
    }
    *optionsp = obuf;
  }
  *userp = ubuf;
  *passwdp = pbuf;
  return CURLE_OK;
error:
  free(ubuf);
  free(pbuf);
  return CURLE_OUT_OF_MEMORY;
}